

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O1

int main(void)

{
  _Bool _Var1;
  int x;
  mfb_update_state mVar2;
  ulong uVar3;
  mfb_window *window;
  mfb_window *window_00;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  memset(g_buffer_low,0x7f,0x100000);
  uVar3 = 0x80;
  lVar4 = 0x1483b0;
  do {
    uVar5 = (int)uVar3 * 0xff + 0x3fff8080U >> 8 | 0xdf0000;
    if ((uVar3 & 1) == 0) {
      uVar5 = 0;
    }
    lVar6 = 0;
    do {
      *(uint *)(lVar4 + lVar6) = uVar5;
      lVar6 = lVar6 + 0x800;
    } while (lVar6 != 0x80000);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (uVar3 != 0x180);
  memset(g_buffer_high,0x7f,0x400000);
  uVar3 = 0x100;
  lVar4 = 0x3085b0;
  do {
    uVar5 = (int)uVar3 * 0xff + 0x7fff0100U >> 9 | 0xdf0000;
    if ((uVar3 & 1) == 0) {
      uVar5 = 0;
    }
    lVar6 = 0;
    do {
      *(uint *)(lVar4 + lVar6) = uVar5;
      lVar6 = lVar6 + 0x1000;
    } while (lVar6 != 0x200000);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 4;
  } while (uVar3 != 0x300);
  window = mfb_open("LowRes",0x200,0x200);
  window_00 = mfb_open("HighRes",0x200,0x200);
  if (window_00 != (mfb_window *)0x0 || window != (mfb_window *)0x0) {
    do {
      if (((window == (mfb_window *)0x0) ||
          (mVar2 = mfb_update_ex(window,g_buffer_low,0x200,0x200), mVar2 != STATE_OK)) ||
         (_Var1 = mfb_wait_sync(window), !_Var1)) {
        window = (mfb_window *)0x0;
      }
      if (((window_00 == (mfb_window *)0x0) ||
          (mVar2 = mfb_update_ex(window_00,g_buffer_high,0x400,0x400), mVar2 != STATE_OK)) ||
         (_Var1 = mfb_wait_sync(window_00), !_Var1)) {
        window_00 = (mfb_window *)0x0;
      }
    } while (window_00 != (mfb_window *)0x0 || window != (mfb_window *)0x0);
  }
  return 0;
}

Assistant:

int 
main()
{
  pretty_square(g_buffer_low, DIMEN_LOW);
  pretty_square(g_buffer_high, DIMEN_HIGH);

  struct mfb_window *window_low = mfb_open("LowRes", DIMEN_LOW, DIMEN_LOW);
  struct mfb_window *window_high = mfb_open("HighRes", DIMEN_HIGH/2, DIMEN_HIGH/2);

  while (window_high || window_low)
    {
      if (window_low)
	if (mfb_update_ex(window_low, g_buffer_low, DIMEN_LOW, DIMEN_LOW) != STATE_OK
	      || !mfb_wait_sync(window_low))
	    window_low = NULL;

      if (window_high)
	if (mfb_update_ex(window_high, g_buffer_high, DIMEN_HIGH, DIMEN_HIGH) != STATE_OK
	    || !mfb_wait_sync(window_high))
	  window_high = NULL;
    }
  
  return 0;
}